

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian-white-noise.cpp
# Opt level: O2

void __thiscall
stateObservation::GaussianWhiteNoise::setDimension(GaussianWhiteNoise *this,uint dim)

{
  ulong rows;
  IdentityReturnType local_30;
  
  this->dim_ = dim;
  rows = (ulong)dim;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&local_30,rows,1);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&this->bias_,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_30);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_30,rows,rows);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->std_,&local_30);
  return;
}

Assistant:

void GaussianWhiteNoise::setDimension(unsigned dim)
    {
        dim_=dim;
        bias_=Vector::Zero(dim,1);
        std_=Matrix::Identity(dim, dim);
    }